

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_exec(int nargs,char **args)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  char *ptrs [32];
  int background;
  int status;
  int ret;
  char *local_128 [33];
  int local_1c;
  uint local_18;
  __pid_t local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_1c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  iVar1 = strcmp(*(char **)(in_RSI + (long)(in_EDI + -1) * 8),"&");
  if (iVar1 == 0) {
    local_1c = 1;
    local_8 = local_8 + -1;
  }
  local_14 = fork();
  if (local_14 != 0) {
    if (local_1c == 0) {
      waitpid(local_14,(int *)&local_18,0);
      if ((local_18 & 0x7f) == 0) {
        local_4 = (int)(local_18 & 0xff00) >> 8;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
    return local_4;
  }
  memset(local_128,0,0x100);
  memcpy(local_128,(void *)(local_10 + 8),(long)(local_8 + -1) << 3);
  local_14 = execv(local_128[0],local_128);
  _exit(local_14);
}

Assistant:

int do_exec(int nargs, char **args)
{
    int ret, status, background = 0;
    char *ptrs[32];

    if(!strcmp(args[nargs-1], "&")) {
        background = 1;
        --nargs;
    }
    ret = fork();
    if (ret) {
        if (!background) {
            waitpid(ret, &status, 0);
            if (WIFEXITED(status))
                return WEXITSTATUS(status);
            else
               return 1;
        }
        return 0;
    }

    memset(ptrs, 0, sizeof(ptrs));
    memcpy(ptrs, &args[1], (nargs-1)*sizeof(char*));
    ret = execv(ptrs[0], ptrs);
    _exit(ret);
}